

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::CondVar::WaitWithDeadline(CondVar *this,Mutex *mu,Time deadline)

{
  bool bVar1;
  Time t;
  KernelTimeout local_30;
  Mutex *local_28;
  Mutex *mu_local;
  CondVar *this_local;
  Time deadline_local;
  
  this_local = (CondVar *)deadline.rep_.rep_hi_;
  deadline_local.rep_.rep_hi_._0_4_ = deadline.rep_.rep_lo_;
  t.rep_._12_4_ = 0;
  t.rep_.rep_hi_ = SUB128(deadline.rep_._0_12_,0);
  t.rep_.rep_lo_ = SUB124(deadline.rep_._0_12_,8);
  local_28 = mu;
  mu_local = (Mutex *)this;
  synchronization_internal::KernelTimeout::KernelTimeout(&local_30,t);
  bVar1 = WaitCommon(this,mu,local_30);
  return bVar1;
}

Assistant:

bool CondVar::WaitWithDeadline(Mutex *mu, absl::Time deadline) {
  return WaitCommon(mu, KernelTimeout(deadline));
}